

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O3

int Sfm_NtkPerform(Sfm_Ntk_t *p,Sfm_Par_t *pPars)

{
  int iVar1;
  Vec_Str_t *pVVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  timespec ts;
  int local_44;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeTotal = lVar6;
  if (pPars->fVerbose != 0) {
    pVVar2 = p->vFixed;
    uVar11 = 0;
    if ((pVVar2 != (Vec_Str_t *)0x0) && (0 < (long)pVVar2->nSize)) {
      lVar6 = 0;
      uVar11 = 0;
      do {
        uVar11 = (ulong)(uint)((int)uVar11 + (int)pVVar2->pArray[lVar6]);
        lVar6 = lVar6 + 1;
      } while (pVVar2->nSize != lVar6);
    }
    pVVar2 = p->vEmpty;
    iVar3 = 0;
    if ((pVVar2 != (Vec_Str_t *)0x0) && (iVar3 = 0, 0 < (long)pVVar2->nSize)) {
      lVar6 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + pVVar2->pArray[lVar6];
        lVar6 = lVar6 + 1;
      } while (pVVar2->nSize != lVar6);
    }
    printf("Performing MFS with %d PIs, %d POs, %d nodes (%d flexible, %d fixed, %d empty).\n",
           (ulong)(uint)p->nPis,(ulong)(uint)p->nPos,(ulong)(uint)p->nNodes,
           (ulong)(uint)(p->nNodes - (int)uVar11),uVar11,iVar3);
  }
  p->pPars = pPars;
  Sfm_NtkPrepare(p);
  uVar12 = p->nPis;
  iVar3 = p->nPos;
  uVar4 = (p->vFanins).nSize;
  uVar11 = (ulong)uVar4;
  iVar5 = uVar4 - iVar3;
  iVar7 = 0;
  iVar9 = 0;
  if ((int)uVar12 < iVar5) {
    if ((int)uVar12 < 0) goto LAB_00524d7e;
    uVar10 = uVar4;
    if ((int)uVar4 < (int)uVar12) {
      uVar10 = uVar12;
    }
    if (uVar10 - uVar12 <= (~uVar12 + uVar4) - iVar3) goto LAB_00524d7e;
    piVar8 = &(p->vFanins).pArray[uVar12].nSize;
    iVar9 = 0;
    uVar10 = uVar12;
    do {
      iVar9 = iVar9 + (uint)(0 < *piVar8);
      uVar10 = uVar10 + 1;
      piVar8 = piVar8 + 4;
    } while ((int)uVar10 < iVar5);
  }
  p->nTotalNodesBeg = iVar9;
  if (0 < (int)uVar4) {
    lVar6 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + *(int *)((long)&((p->vFanins).pArray)->nSize + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (uVar11 << 4 != lVar6);
  }
  p->nTotalEdgesBeg = iVar7 - iVar3;
  iVar7 = p->nObjs;
  iVar9 = 0;
  if ((int)(iVar3 + uVar12) < iVar7) {
    uVar11 = (ulong)uVar12;
    local_44 = 0;
    do {
      if ((int)uVar12 < 0) {
LAB_00524d5f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      iVar5 = (int)uVar11;
      if (p->vFixed->nSize <= iVar5) goto LAB_00524d5f;
      if (p->vFixed->pArray[uVar11] == '\0') {
        iVar1 = p->pPars->nDepthMax;
        if (iVar1 != 0) {
          if ((p->vLevels).nSize <= iVar5) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (iVar1 < (p->vLevels).pArray[uVar11]) goto LAB_00524bbd;
        }
        if ((p->vFanins).nSize <= iVar5) goto LAB_00524d7e;
        if (0xfffffffa < (p->vFanins).pArray[uVar11].nSize - 7U) {
          iVar3 = 1;
          do {
            iVar7 = Sfm_NodeResub(p,iVar5);
            iVar3 = iVar3 + -1;
          } while (iVar7 != 0);
          local_44 = (local_44 + 1) - (uint)(iVar3 == 0);
          iVar3 = p->nPos;
          if ((pPars->nNodesMax != 0) && (pPars->nNodesMax <= local_44)) break;
          iVar7 = p->nObjs;
        }
      }
LAB_00524bbd:
      uVar11 = uVar11 + 1;
    } while ((int)uVar11 + iVar3 < iVar7);
    uVar12 = p->nPis;
    uVar4 = (p->vFanins).nSize;
    uVar11 = (ulong)uVar4;
    iVar5 = uVar4 - iVar3;
  }
  else {
    local_44 = 0;
  }
  uVar4 = (uint)uVar11;
  if (iVar5 <= (int)uVar12) {
LAB_00524cba:
    p->nTotalNodesEnd = iVar9;
    if ((int)uVar4 < 1) {
      iVar5 = 0;
    }
    else {
      lVar6 = 0;
      iVar5 = 0;
      do {
        iVar5 = iVar5 + *(int *)((long)&((p->vFanins).pArray)->nSize + lVar6);
        lVar6 = lVar6 + 0x10;
      } while (uVar11 << 4 != lVar6);
    }
    p->nTotalEdgesEnd = iVar5 - iVar3;
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    p->timeTotal = lVar6 - p->timeTotal;
    if (pPars->fVerbose != 0) {
      Sfm_NtkPrintStats(p);
    }
    return local_44;
  }
  if (-1 < (int)uVar12) {
    uVar10 = uVar4;
    if ((int)uVar4 < (int)uVar12) {
      uVar10 = uVar12;
    }
    if ((~uVar12 + uVar4) - iVar3 < uVar10 - uVar12) {
      piVar8 = &(p->vFanins).pArray[uVar12].nSize;
      iVar9 = 0;
      do {
        iVar9 = iVar9 + (uint)(0 < *piVar8);
        uVar12 = uVar12 + 1;
        piVar8 = piVar8 + 4;
      } while ((int)uVar12 < iVar5);
      goto LAB_00524cba;
    }
  }
LAB_00524d7e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Sfm_NtkPerform( Sfm_Ntk_t * p, Sfm_Par_t * pPars )
{
    int i, k, Counter = 0;
    //Sfm_NtkPrint( p );
    p->timeTotal = Abc_Clock();
    if ( pPars->fVerbose )
    {
        int nFixed = p->vFixed ? Vec_StrSum(p->vFixed) : 0;
        int nEmpty = p->vEmpty ? Vec_StrSum(p->vEmpty) : 0;
        printf( "Performing MFS with %d PIs, %d POs, %d nodes (%d flexible, %d fixed, %d empty).\n", 
            p->nPis, p->nPos, p->nNodes, p->nNodes-nFixed, nFixed, nEmpty );
    }
    p->pPars = pPars;
    Sfm_NtkPrepare( p );
//    Sfm_ComputeInterpolantCheck( p );
//    return 0;
    p->nTotalNodesBeg = Vec_WecSizeUsedLimits( &p->vFanins, Sfm_NtkPiNum(p), Vec_WecSize(&p->vFanins) - Sfm_NtkPoNum(p) );
    p->nTotalEdgesBeg = Vec_WecSizeSize(&p->vFanins) - Sfm_NtkPoNum(p);
    Sfm_NtkForEachNode( p, i )
    {
        if ( Sfm_ObjIsFixed( p, i ) )
            continue;
        if ( p->pPars->nDepthMax && Sfm_ObjLevel(p, i) > p->pPars->nDepthMax )
            continue;
        if ( Sfm_ObjFaninNum(p, i) < 2 || Sfm_ObjFaninNum(p, i) > 6 )
            continue;
        for ( k = 0; Sfm_NodeResub(p, i); k++ )
        {
//            Counter++;
//            break;
        }
        Counter += (k > 0);
        if ( pPars->nNodesMax && Counter >= pPars->nNodesMax )
            break;
    }
    p->nTotalNodesEnd = Vec_WecSizeUsedLimits( &p->vFanins, Sfm_NtkPiNum(p), Vec_WecSize(&p->vFanins) - Sfm_NtkPoNum(p) );
    p->nTotalEdgesEnd = Vec_WecSizeSize(&p->vFanins) - Sfm_NtkPoNum(p);
    p->timeTotal = Abc_Clock() - p->timeTotal;
    if ( pPars->fVerbose )
        Sfm_NtkPrintStats( p );
    //Sfm_NtkPrint( p );
    return Counter;
}